

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O0

_Bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream,void *val)

{
  undefined8 in_RSI;
  long in_RDI;
  ALLEGRO_MUTEX *stream_mutex;
  _Bool ret;
  size_t i;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  uint error;
  undefined1 local_19;
  undefined8 local_18;
  
  maybe_lock_mutex((ALLEGRO_MUTEX *)0x110d2f);
  local_18 = 0;
  while( true ) {
    error = in_stack_ffffffffffffffd4 & 0xffffff;
    if (local_18 < *(uint *)(in_RDI + 0x110)) {
      error = CONCAT13(*(long *)(*(long *)(in_RDI + 0x120) + local_18 * 8) != 0,
                       (int3)in_stack_ffffffffffffffd4);
    }
    if ((char)(error >> 0x18) == '\0') break;
    local_18 = local_18 + 1;
    in_stack_ffffffffffffffd4 = error;
  }
  local_19 = *(uint *)(in_RDI + 0x110) <= local_18;
  if (local_19) {
    _al_set_error(error,in_stack_ffffffffffffffc8);
  }
  else {
    *(undefined8 *)(*(long *)(in_RDI + 0x120) + local_18 * 8) = in_RSI;
  }
  local_19 = !local_19;
  maybe_unlock_mutex((ALLEGRO_MUTEX *)0x110de9);
  return local_19;
}

Assistant:

bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream, void *val)
{
   size_t i;
   bool ret;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);

   for (i = 0; i < stream->buf_count && stream->pending_bufs[i] ; i++)
      ;
   if (i < stream->buf_count) {
      stream->pending_bufs[i] = val;
      ret = true;
   }
   else {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to set a stream buffer with a full pending list");
      ret = false;
   }

   maybe_unlock_mutex(stream_mutex);

   return ret;
}